

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atexit.c
# Opt level: O1

int main(void)

{
  _func_void **pp_Var1;
  int iVar2;
  
  if (_PDCLIB_exitptr == 0x28) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/atexit.c, line %d - %s\n"
           ,0x39,"atexit( &checkhandler ) == 0");
  }
  else {
    pp_Var1 = _PDCLIB_exitstack + _PDCLIB_exitptr;
    _PDCLIB_exitptr = _PDCLIB_exitptr + 1;
    *pp_Var1 = checkhandler;
  }
  iVar2 = 0x20;
  do {
    if (_PDCLIB_exitptr == 0x28) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/atexit.c, line %d - %s\n"
             ,0x3d,"atexit( &counthandler ) == 0");
    }
    else {
      pp_Var1 = _PDCLIB_exitstack + _PDCLIB_exitptr;
      _PDCLIB_exitptr = _PDCLIB_exitptr + 1;
      *pp_Var1 = counthandler;
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return TEST_RESULTS;
}

Assistant:

int atexit( void ( *func )( void ) )
{
    if ( _PDCLIB_exitptr == _PDCLIB_ATEXIT_SLOTS )
    {
        return -1;
    }
    else
    {
        _PDCLIB_exitstack[ _PDCLIB_exitptr++ ] = func;
        return 0;
    }
}